

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

bool Args::details::argNameLess<Args::ArgIface*>(ArgIface **a1,ArgIface **a2)

{
  uint uVar1;
  reference pcVar2;
  ulong uVar3;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe62;
  undefined1 in_stack_fffffffffffffe63;
  byte bVar4;
  undefined1 uVar5;
  undefined1 in_stack_fffffffffffffe64;
  undefined1 in_stack_fffffffffffffe65;
  byte bVar6;
  undefined1 uVar7;
  byte bVar8;
  byte bVar9;
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [39];
  byte local_111;
  string local_110 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  string local_e8 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  byte local_b9;
  string local_b8 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_90 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  byte local_65;
  string local_58 [32];
  string local_38 [32];
  undefined8 *local_18;
  undefined8 *local_10;
  byte local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  (**(code **)(*(long *)*in_RDI + 0x18))(local_38);
  uVar1 = std::__cxx11::string::empty();
  local_65 = 0;
  bVar8 = 0;
  if ((uVar1 & 1) == 0) {
    (**(code **)(*(long *)*local_18 + 0x18))(local_58);
    local_65 = 1;
    bVar8 = std::__cxx11::string::empty();
    bVar8 = bVar8 ^ 0xff;
  }
  bVar9 = bVar8;
  if ((local_65 & 1) != 0) {
    std::__cxx11::string::~string(local_58);
  }
  std::__cxx11::string::~string(local_38);
  if ((bVar8 & 1) == 0) {
    (**(code **)(*(long *)*local_10 + 0x18))(local_178);
    (**(code **)(*(long *)*local_18 + 0x18))(local_198);
    local_1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(bVar9,CONCAT16(bVar8,CONCAT15(in_stack_fffffffffffffe65,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffe64,
                                                  CONCAT13(in_stack_fffffffffffffe63,
                                                           CONCAT12(in_stack_fffffffffffffe62,
                                                                    in_stack_fffffffffffffe60)))))),
                             in_stack_fffffffffffffe58);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_178);
  }
  else {
    (**(code **)(*(long *)*local_10 + 0x18))(local_90);
    local_70._M_current = (char *)std::__cxx11::string::cbegin();
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_70);
    local_b9 = 0;
    bVar6 = false;
    if (*pcVar2 != '-') {
      (**(code **)(*(long *)*local_18 + 0x18))(local_b8);
      local_b9 = 1;
      local_98._M_current = (char *)std::__cxx11::string::cbegin();
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_98);
      bVar6 = *pcVar2 == '-';
    }
    uVar7 = bVar6;
    if ((local_b9 & 1) != 0) {
      std::__cxx11::string::~string(local_b8);
    }
    std::__cxx11::string::~string(local_90);
    if ((bVar6 & 1) == 0) {
      (**(code **)(*(long *)*local_10 + 0x18))(local_e8);
      local_c8._M_current = (char *)std::__cxx11::string::cbegin();
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_c8);
      local_111 = 0;
      bVar4 = false;
      if (*pcVar2 == '-') {
        (**(code **)(*(long *)*local_18 + 0x18))(local_110);
        local_111 = 1;
        local_f0._M_current = (char *)std::__cxx11::string::cbegin();
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_f0);
        bVar4 = *pcVar2 != '-';
      }
      uVar5 = bVar4;
      if ((local_111 & 1) != 0) {
        std::__cxx11::string::~string(local_110);
      }
      std::__cxx11::string::~string(local_e8);
      if ((bVar4 & 1) == 0) {
        (**(code **)(*(long *)*local_10 + 0x40))();
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) != 0) {
          (**(code **)(*(long *)*local_18 + 0x40))();
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            local_1 = 1;
            goto LAB_0015e12a;
          }
        }
        (**(code **)(*(long *)*local_10 + 0x40))();
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          (**(code **)(*(long *)*local_18 + 0x40))();
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) != 0) {
            local_1 = 0;
            goto LAB_0015e12a;
          }
        }
        (**(code **)(*(long *)*local_10 + 0x18))(local_138);
        (**(code **)(*(long *)*local_18 + 0x18))(local_158);
        local_1 = std::operator<((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(bVar9,CONCAT16(bVar8,CONCAT15(uVar7,CONCAT14(bVar6,
                                                  CONCAT13(uVar5,CONCAT12(bVar4,
                                                  in_stack_fffffffffffffe60)))))),
                                 in_stack_fffffffffffffe58);
        std::__cxx11::string::~string(local_158);
        std::__cxx11::string::~string(local_138);
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 1;
    }
  }
LAB_0015e12a:
  return (bool)(local_1 & 1);
}

Assistant:

bool argNameLess( const T & a1, const T & a2 )
{
	static const Char dash = SL( '-' );

	if( !a1->name().empty() && !a2->name().empty() )
	{
		if( *( a1->name().cbegin() ) != dash &&
				*( a2->name().cbegin() ) == dash )
			return true;
		else if( *( a1->name().cbegin() ) == dash &&
				*( a2->name().cbegin() ) != dash )
			return false;
		else if( a1->argumentName().empty() && !a2->argumentName().empty() )
			return true;
		else if( !a1->argumentName().empty() && a2->argumentName().empty() )
			return false;
		else
			return ( a1->name() < a2->name() );
	}
	else
		return ( a1->name() < a2->name() );
}